

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

C * __thiscall
axl::sl::StringBase<short,_axl::sl::StringDetailsBase<short>_>::insertSpace
          (StringBase<short,_axl::sl::StringDetailsBase<short>_> *this,size_t index,size_t length)

{
  ulong uVar1;
  C *pCVar2;
  size_t sVar3;
  
  uVar1 = (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_length;
  pCVar2 = createBuffer(this,uVar1 + length,true);
  if (pCVar2 == (C *)0x0) {
    pCVar2 = (C *)0x0;
  }
  else {
    sVar3 = index;
    if (uVar1 < index) {
      sVar3 = uVar1;
    }
    pCVar2 = (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_p + sVar3;
    if (length != 0 && index < uVar1) {
      memmove(pCVar2 + length,pCVar2,(uVar1 - sVar3) * 2);
    }
  }
  return pCVar2;
}

Assistant:

C*
	insertSpace(
		size_t index,
		size_t length
	) {
		size_t oldLength = this->m_length;

		if (!createBuffer(oldLength + length, true))
			return NULL;

		if (index > oldLength)
			index = oldLength;

		C* dst = this->m_p + index;

		if (length && index < oldLength)
			Details::move(dst + length, dst, oldLength - index);

		return dst;
	}